

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi-seq.c
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  timespec tv;
  timespec local_28;
  
  if (1 < argc) {
    lVar1 = atol(argv[1]);
    clock_gettime(1,&local_28);
    if (lVar1 == 0) {
      dVar9 = 0.0;
    }
    else {
      uVar3 = 0x12d591;
      lVar2 = 0;
      lVar4 = lVar1;
      do {
        iVar5 = uVar3 * 0x41c64e6d;
        uVar6 = (iVar5 + 0x3039U) / 0x7fffffff;
        iVar7 = uVar3 * -0x3d5d6597;
        uVar3 = iVar7 + 0xd3dc167e;
        dVar9 = (double)(int)(iVar5 + (uVar6 << 0x1f | uVar6) + 0x3039) / 2147483647.0;
        dVar11 = (double)(int)(iVar7 + (uVar3 / 0x7fffffff << 0x1f | uVar3 / 0x7fffffff) +
                              -0x2c23e982) / 2147483647.0;
        lVar2 = lVar2 + (ulong)(SQRT(dVar9 * dVar9 + dVar11 * dVar11) < 1.0);
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      auVar8._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar8._0_8_ = lVar2;
      auVar8._12_4_ = 0x45300000;
      dVar9 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * 4.0;
    }
    dVar10 = (double)local_28.tv_nsec;
    dVar11 = (double)local_28.tv_sec;
    clock_gettime(1,&local_28);
    printf("pi(%ld) = %.12lf (accuracy: %.12lf)\n",dVar9 / (double)lVar1,
           SUB84(ABS(3.141592653589793 - dVar9 / (double)lVar1) / 3.141592653589793,0),lVar1);
    printf("Time: %f\n",
           ((double)local_28.tv_nsec * 1e-09 + (double)local_28.tv_sec) - (dVar10 * 1e-09 + dVar11))
    ;
    return 0;
  }
  main_cold_1();
  halt_baddata();
}

Assistant:

int main(int argc, char **argv)
{
    if (argc <= 1) {
        usage(argv[0]);
        exit(1);
    }

    const long n = atol(argv[1]);

    double x, y;
    uint64_t count = 0;
    unsigned int seed = 1234321;
    long m = n;

    double t1 = wctime();
    while (m--) {
        x = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        y = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        if (sqrt(x*x+y*y) < 1.0) ++count;
    }
    double pi = 4.0*(double)count/n;
    double t2 = wctime();

    printf("pi(%ld) = %.12lf (accuracy: %.12lf)\n", n, pi, fabs(M_PI-pi)/M_PI);
    printf("Time: %f\n", t2-t1);

    return 0;
}